

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

void opus_tags_clear(OpusTags *_tags)

{
  int iVar1;
  int iVar2;
  long lVar4;
  uint uVar3;
  
  iVar1 = _tags->comments;
  uVar3 = (uint)(_tags->user_comments != (char **)0x0);
  iVar2 = uVar3 + iVar1;
  if (iVar2 != 0 && SCARRY4(uVar3,iVar1) == iVar2 < 0) {
    lVar4 = ((long)iVar1 - (ulong)(_tags->user_comments == (char **)0x0)) + 2;
    do {
      free(_tags->user_comments[lVar4 + -2]);
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  free(_tags->user_comments);
  free(_tags->comment_lengths);
  free(_tags->vendor);
  return;
}

Assistant:

void opus_tags_clear(OpusTags *_tags){
  int ncomments;
  int ci;
  ncomments=_tags->comments;
  if(_tags->user_comments!=NULL)ncomments++;
  else{
    OP_ASSERT(ncomments==0);
  }
  for(ci=ncomments;ci-->0;)_ogg_free(_tags->user_comments[ci]);
  _ogg_free(_tags->user_comments);
  _ogg_free(_tags->comment_lengths);
  _ogg_free(_tags->vendor);
}